

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O3

void CMU462::Collada::ColladaWriter::writeMesh(ofstream *out,Mesh *mesh,int id)

{
  list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *plVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  int iVar4;
  char cVar5;
  size_t sVar6;
  _List_node_base *p_Var7;
  ostream *poVar8;
  _List_node_base *p_Var9;
  list<CMU462::Face,_std::allocator<CMU462::Face>_> *plVar10;
  
  iVar4 = (int)(mesh->mesh).vertices.
               super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl._M_node.
               _M_size;
  sVar6 = (mesh->mesh).faces.super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl.
          _M_node._M_size;
  plVar1 = &(mesh->mesh).vertices;
  p_Var7 = (mesh->mesh).vertices.super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  if (p_Var7 != (_List_node_base *)plVar1) {
    p_Var9 = (_List_node_base *)0x0;
    do {
      p_Var7[6]._M_next = p_Var9;
      p_Var9 = (_List_node_base *)((long)&p_Var9->_M_next + 1);
      p_Var7 = p_Var7->_M_next;
    } while (p_Var7 != (_List_node_base *)plVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"      <geometry id=\"M",0x15);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)out,id);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" name=\"Mesh",0xc);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,id);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\">",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"         <mesh>",0xf);
  cVar5 = (char)out;
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar5);
  std::ostream::put(cVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,"            <source id=\"M",0x19);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)out,id);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"-positions\">",0xc);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,"               <float_array id=\"M",0x21);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)out,id);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"-positions-array\" count=\"",0x19);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar4 * 3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\">",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  for (p_Var7 = (plVar1->super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>)._M_impl.
                _M_node.super__List_node_base._M_next; p_Var7 != (_List_node_base *)plVar1;
      p_Var7 = p_Var7->_M_next) {
    p_Var9 = p_Var7[1]._M_prev;
    p_Var2 = p_Var7[2]._M_next;
    p_Var3 = p_Var7[2]._M_prev;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"                  ",0x12);
    poVar8 = std::ostream::_M_insert<double>((double)p_Var9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    poVar8 = std::ostream::_M_insert<double>((double)p_Var2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    poVar8 = std::ostream::_M_insert<double>((double)p_Var3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,"               </float_array>",0x1d);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar5);
  std::ostream::put(cVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,"               <technique_common>",0x21);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar5);
  std::ostream::put(cVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,"                  <accessor source=\"#M",0x26);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)out,id);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"-positions-array\" count=\"",0x19);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" stride=\"3\">",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,"                     <param name=\"X\" type=\"float\"/>",0x33);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar5);
  std::ostream::put(cVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,"                     <param name=\"Y\" type=\"float\"/>",0x33);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar5);
  std::ostream::put(cVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,"                     <param name=\"Z\" type=\"float\"/>",0x33);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar5);
  std::ostream::put(cVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,"                  </accessor>",0x1d);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar5);
  std::ostream::put(cVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,"               </technique_common>",0x22);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar5);
  std::ostream::put(cVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"            </source>",0x15);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar5);
  std::ostream::put(cVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,"            <vertices id=\"M",0x1b);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)out,id);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"-vertices\">",0xb);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,"               <input semantic=\"POSITION\" source=\"#M",0x34);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)out,id);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"-positions\"/>",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"            </vertices>",0x17);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar5);
  std::ostream::put(cVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,"         <polylist count=\"",0x1a);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)out,(int)sVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\">",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,"            <input semantic=\"VERTEX\" source=\"#M",0x2f);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)out,id);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"-vertices\" offset=\"0\"/>",0x17);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"            <vcount>",0x14);
  plVar10 = &(mesh->mesh).faces;
  for (p_Var7 = (mesh->mesh).faces.super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>.
                _M_impl._M_node.super__List_node_base._M_next; p_Var7 != (_List_node_base *)plVar10;
      p_Var7 = p_Var7->_M_next) {
    p_Var9 = p_Var7[0xb]._M_prev;
    do {
      p_Var9 = p_Var9[2]._M_next;
    } while (p_Var7[0xb]._M_prev != p_Var9);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"            </vcount>",0x15);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar5);
  std::ostream::put(cVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"            <p>",0xf);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar5);
  std::ostream::put(cVar5);
  std::ostream::flush();
  for (p_Var7 = (plVar10->super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>)._M_impl.
                _M_node.super__List_node_base._M_next; p_Var7 != (_List_node_base *)plVar10;
      p_Var7 = p_Var7->_M_next) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"               ",0xf);
    p_Var9 = p_Var7[0xb]._M_prev;
    do {
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      p_Var9 = p_Var9[2]._M_next;
    } while (p_Var7[0xb]._M_prev != p_Var9);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar5);
    std::ostream::put(cVar5);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"            </p>",0x10);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar5);
  std::ostream::put(cVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"         </polylist>",0x14);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar5);
  std::ostream::put(cVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"         </mesh>",0x10);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar5);
  std::ostream::put(cVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"      </geometry>",0x11);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar5);
  std::ostream::put(cVar5);
  std::ostream::flush();
  return;
}

Assistant:

void ColladaWriter::writeMesh( ofstream& out, DynamicScene::Mesh* mesh, int id )
{
   HalfedgeMesh& m( mesh->mesh );
   int nV = m.nVertices();
   int nF = m.nFaces();

   // TODO transformations are currently ignored

   // assign a unique ID to each vertex (we will need these so that
   // each polygon can reference its vertices)
   int index = 0;
   for( VertexIter v = m.verticesBegin(); v != m.verticesEnd(); v++ )
   {
      v->index = index;
      index++;
   }

   out << "      <geometry id=\"M" << id << "\" name=\"Mesh" << id << "\">" << endl;
   out << "         <mesh>" << endl;

   // positions -------------
   out << "            <source id=\"M" << id << "-positions\">" << endl;
   out << "               <float_array id=\"M" << id << "-positions-array\" count=\"" << 3*nV << "\">" << endl;
   for( VertexIter v = m.verticesBegin(); v != m.verticesEnd(); v++ )
   {
      Vector3D p = v->position;
      out << "                  ";
      out << p.x << " " << p.y << " " << p.z << endl;
   }
   out << "               </float_array>" << endl;
   out << "               <technique_common>" << endl;
   out << "                  <accessor source=\"#M" << id << "-positions-array\" count=\"" << nV << "\" stride=\"3\">" << endl;
   out << "                     <param name=\"X\" type=\"float\"/>" << endl;
   out << "                     <param name=\"Y\" type=\"float\"/>" << endl;
   out << "                     <param name=\"Z\" type=\"float\"/>" << endl;
   out << "                  </accessor>" << endl;
   out << "               </technique_common>" << endl;
   out << "            </source>" << endl;
   
   // vertices -------------
   out << "            <vertices id=\"M" << id << "-vertices\">" << endl;
   out << "               <input semantic=\"POSITION\" source=\"#M" << id << "-positions\"/>" << endl;
   out << "            </vertices>" << endl;
   
   // polygons -------------
   out << "         <polylist count=\"" << nF << "\">" << endl;
   out << "            <input semantic=\"VERTEX\" source=\"#M" << id << "-vertices\" offset=\"0\"/>" << endl;
   out << "            <vcount>";
   for( FaceIter f = m.facesBegin(); f != m.facesEnd(); f++ )
   {
      out << f->degree() << " ";
   }
   out << "            </vcount>" << endl;
   out << "            <p>" << endl;
   for( FaceIter f = m.facesBegin(); f != m.facesEnd(); f++ )
   {
      out << "               ";
      HalfedgeIter h = f->halfedge();
      do
      {
         out << h->vertex()->index << " ";
         h = h->next();
      }
      while( h != f->halfedge() );
      out << endl;
   }
   out << "            </p>" << endl;
   out << "         </polylist>" << endl;

   out << "         </mesh>" << endl;
   out << "      </geometry>" << endl;
}